

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fClippingTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles2::Functional::(anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Vec4 *p)

{
  float fVar1;
  float fVar2;
  undefined1 local_190 [8];
  ostringstream msg;
  Vec4 *p_local;
  
  msg._368_8_ = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  fVar1 = tcu::Vector<float,_4>::x((Vector<float,_4> *)msg._368_8_);
  fVar2 = tcu::Vector<float,_4>::w((Vector<float,_4> *)msg._368_8_);
  if (fVar1 < -fVar2) {
    std::operator<<((ostream *)local_190,"\t(-X clip)");
  }
  fVar1 = tcu::Vector<float,_4>::x((Vector<float,_4> *)msg._368_8_);
  fVar2 = tcu::Vector<float,_4>::w((Vector<float,_4> *)msg._368_8_);
  if (fVar2 < fVar1) {
    std::operator<<((ostream *)local_190,"\t(+X clip)");
  }
  fVar1 = tcu::Vector<float,_4>::y((Vector<float,_4> *)msg._368_8_);
  fVar2 = tcu::Vector<float,_4>::w((Vector<float,_4> *)msg._368_8_);
  if (fVar1 < -fVar2) {
    std::operator<<((ostream *)local_190,"\t(-Y clip)");
  }
  fVar1 = tcu::Vector<float,_4>::y((Vector<float,_4> *)msg._368_8_);
  fVar2 = tcu::Vector<float,_4>::w((Vector<float,_4> *)msg._368_8_);
  if (fVar2 < fVar1) {
    std::operator<<((ostream *)local_190,"\t(+Y clip)");
  }
  fVar1 = tcu::Vector<float,_4>::z((Vector<float,_4> *)msg._368_8_);
  fVar2 = tcu::Vector<float,_4>::w((Vector<float,_4> *)msg._368_8_);
  if (fVar1 < -fVar2) {
    std::operator<<((ostream *)local_190,"\t(-Z clip)");
  }
  fVar1 = tcu::Vector<float,_4>::z((Vector<float,_4> *)msg._368_8_);
  fVar2 = tcu::Vector<float,_4>::w((Vector<float,_4> *)msg._368_8_);
  if (fVar2 < fVar1) {
    std::operator<<((ostream *)local_190,"\t(+Z clip)");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string genClippingPointInfoString(const tcu::Vec4& p)
{
	std::ostringstream msg;

	if (p.x() < -p.w())		msg << "\t(-X clip)";
	if (p.x() >  p.w())		msg << "\t(+X clip)";
	if (p.y() < -p.w())		msg << "\t(-Y clip)";
	if (p.y() >  p.w())		msg << "\t(+Y clip)";
	if (p.z() < -p.w())		msg << "\t(-Z clip)";
	if (p.z() >  p.w())		msg << "\t(+Z clip)";

	return msg.str();
}